

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_binding_resolver.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnBindingResolver::VisitOperator(ColumnBindingResolver *this,LogicalOperator *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  LogicalOperatorType LVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  pointer pLVar2;
  pointer puVar3;
  pointer puVar4;
  char cVar5;
  LogicalExtensionOperator *pLVar6;
  reference pvVar7;
  type pLVar8;
  LogicalAnyJoin *pLVar9;
  pointer pLVar10;
  InternalException *this_01;
  LogicalCreateIndex *pLVar11;
  ColumnList *pCVar12;
  LogicalInsert *pLVar13;
  LogicalRecursiveCTE *pLVar14;
  JoinCondition *cond;
  pointer puVar15;
  pointer pLVar16;
  LogicalComparisonJoin *comp_join;
  pointer puVar17;
  JoinCondition *cond_1;
  vector<duckdb::ColumnBinding,_true> right_bindings;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_48;
  
  LVar1 = op->type;
  switch(LVar1) {
  case LOGICAL_DELIM_JOIN:
    this_00 = &op->children;
    if (*(char *)&op[2].expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish == '\x01') {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(this_00,1);
      unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
      operator*(pvVar7);
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this);
      pLVar2 = (pointer)op[1].estimated_cardinality;
      for (pLVar16 = op[1].types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar16 != pLVar2;
          pLVar16 = pLVar16 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this);
      }
    }
    else {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(this_00,0);
      unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
      operator*(pvVar7);
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this);
      pLVar2 = (pointer)op[1].estimated_cardinality;
      for (pLVar16 = op[1].types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar16 != pLVar2;
          pLVar16 = pLVar16 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this);
      }
    }
    puVar3 = op[2].children.
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (puVar15 = op[2].children.
                   super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; puVar15 != puVar3;
        puVar15 = puVar15 + 1) {
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this);
    }
    if (*(char *)&op[2].expressions.
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish == '\0') {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(this_00,1);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar7);
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar8);
      pLVar2 = (pointer)op[1].estimated_cardinality;
      for (pLVar16 = op[1].types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar16 != pLVar2;
          pLVar16 = pLVar16 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])
                  (this,&pLVar16->type_info_);
      }
    }
    else {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(this_00,0);
      pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator*(pvVar7);
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar8);
      pLVar2 = (pointer)op[1].estimated_cardinality;
      for (pLVar16 = op[1].types.
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar16 != pLVar2;
          pLVar16 = pLVar16 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,pLVar16);
      }
    }
    break;
  case LOGICAL_COMPARISON_JOIN:
  case LOGICAL_ASOF_JOIN:
    pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(&op->children,0);
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(pvVar7);
    (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar8);
    pLVar2 = (pointer)op[1].estimated_cardinality;
    for (pLVar16 = op[1].types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar16 != pLVar2;
        pLVar16 = pLVar16 + 1) {
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,pLVar16);
    }
    if (op[2].types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,&op[2].types);
    }
    puVar3 = op[2].children.
             super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (puVar15 = op[2].children.
                   super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; puVar15 != puVar3;
        puVar15 = puVar15 + 1) {
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,puVar15);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(&op->children,1);
    pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator*(pvVar7);
    (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[2])(this,pLVar8);
    pLVar2 = (pointer)op[1].estimated_cardinality;
    for (pLVar16 = op[1].types.
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage; pLVar16 != pLVar2;
        pLVar16 = pLVar16 + 1) {
      (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])
                (this,&pLVar16->type_info_);
    }
    break;
  case LOGICAL_ANY_JOIN:
    LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
    (*op->_vptr_LogicalOperator[2])(&right_bindings,op);
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
              (&(this->bindings).
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
               &right_bindings);
    ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
    ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                  &right_bindings);
    pLVar9 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>(op);
    cVar5 = (pLVar9->super_LogicalJoin).super_LogicalOperator.field_0x61;
    if ((byte)(cVar5 - 5U) < 2) {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&op->children,1);
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(pvVar7);
      (*pLVar10->_vptr_LogicalOperator[2])(&right_bindings,pLVar10);
      ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
      insert<__gnu_cxx::__normal_iterator<duckdb::ColumnBinding*,std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>>,void>
                ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                 &this->bindings,
                 (this->bindings).
                 super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                 super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
                  )right_bindings.
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
                  )right_bindings.
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &right_bindings);
      cVar5 = (pLVar9->super_LogicalJoin).super_LogicalOperator.field_0x61;
    }
    if ((byte)(cVar5 - 9U) < 2) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&right_bindings,"RIGHT SEMI/ANTI any join not supported yet",
                 (allocator *)&local_48);
      InternalException::InternalException(this_01,(string *)&right_bindings);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_0194e7ad;
  default:
    if (LVar1 == LOGICAL_GET) {
      (*op->_vptr_LogicalOperator[2])(&right_bindings,op);
LAB_0194e799:
      ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
                (&(this->bindings).
                  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
                 &right_bindings);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &right_bindings);
LAB_0194e7ad:
      LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
      return;
    }
    if (LVar1 == LOGICAL_RECURSIVE_CTE) {
      pLVar14 = LogicalOperator::Cast<duckdb::LogicalRecursiveCTE>(op);
      LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
      (*op->_vptr_LogicalOperator[2])(&right_bindings,op);
      ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
                (&(this->bindings).
                  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
                 &right_bindings);
      ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
      ~_Vector_base((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
                    &right_bindings);
      puVar4 = (pLVar14->key_targets).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar17 = (pLVar14->key_targets).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar4;
          puVar17 = puVar17 + 1) {
        (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])(this,puVar17);
      }
      return;
    }
    if (LVar1 == LOGICAL_INSERT) {
      pLVar13 = LogicalOperator::Cast<duckdb::LogicalInsert>(op);
      if (pLVar13->action_type != THROW) {
        LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
        pCVar12 = TableCatalogEntry::GetColumns(pLVar13->table);
        LogicalOperator::GenerateColumnBindings
                  (&right_bindings,pLVar13->excluded_table_index,
                   (long)(pCVar12->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pCVar12->physical_columns).
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3);
        ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
        insert<__gnu_cxx::__normal_iterator<duckdb::ColumnBinding*,std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>>,void>
                  ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                   &this->bindings,
                   (this->bindings).
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
                    )right_bindings.
                     super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                     super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<duckdb::ColumnBinding_*,_std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>_>
                    )right_bindings.
                     super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                     super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        if ((pLVar13->on_conflict_condition).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])
                    (this,&pLVar13->on_conflict_condition);
        }
        if ((pLVar13->do_update_condition).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          (*(this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor[3])
                    (this,&pLVar13->do_update_condition);
        }
        LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
        (*op->_vptr_LogicalOperator[2])(&local_48,op);
        ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
                  (&(this->bindings).
                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
                   &local_48);
        ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::
        ~_Vector_base(&local_48);
        goto LAB_0194e8c6;
      }
    }
    else {
      if (LVar1 == LOGICAL_CREATE_INDEX) {
        pLVar11 = LogicalOperator::Cast<duckdb::LogicalCreateIndex>(op);
        pCVar12 = TableCatalogEntry::GetColumns(pLVar11->table);
        LogicalOperator::GenerateColumnBindings
                  (&right_bindings,0,
                   ((long)(pCVar12->columns).
                          super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          .
                          super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pCVar12->columns).
                         super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         .
                         super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0xd8);
        goto LAB_0194e799;
      }
      if (LVar1 == LOGICAL_EXTENSION_OPERATOR) {
        pLVar6 = LogicalOperator::Cast<duckdb::LogicalExtensionOperator>(op);
        UNRECOVERED_JUMPTABLE = (pLVar6->super_LogicalOperator)._vptr_LogicalOperator[0x10];
        (*UNRECOVERED_JUMPTABLE)(pLVar6,this,&this->bindings,UNRECOVERED_JUMPTABLE);
        return;
      }
    }
  case LOGICAL_CROSS_PRODUCT:
  case LOGICAL_POSITIONAL_JOIN:
    LogicalOperatorVisitor::VisitOperatorChildren(&this->super_LogicalOperatorVisitor,op);
    LogicalOperatorVisitor::VisitOperatorExpressions(&this->super_LogicalOperatorVisitor,op);
  }
  (*op->_vptr_LogicalOperator[2])(&right_bindings,op);
  ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::_M_move_assign
            (&(this->bindings).
              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
             &right_bindings);
LAB_0194e8c6:
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &right_bindings);
  return;
}

Assistant:

void ColumnBindingResolver::VisitOperator(LogicalOperator &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN: {
		// special case: comparison join
		auto &comp_join = op.Cast<LogicalComparisonJoin>();
		// first get the bindings of the LHS and resolve the LHS expressions
		VisitOperator(*comp_join.children[0]);
		for (auto &cond : comp_join.conditions) {
			VisitExpression(&cond.left);
		}
		// resolve any single-side predicates
		// for now, only ASOF supports this, and we are guaranteed that all right side predicates
		// have been pushed into a filter.
		if (comp_join.predicate) {
			D_ASSERT(op.type == LogicalOperatorType::LOGICAL_ASOF_JOIN);
			VisitExpression(&comp_join.predicate);
		}
		// visit the duplicate eliminated columns on the LHS, if any
		for (auto &expr : comp_join.duplicate_eliminated_columns) {
			VisitExpression(&expr);
		}
		// then get the bindings of the RHS and resolve the RHS expressions
		VisitOperator(*comp_join.children[1]);
		for (auto &cond : comp_join.conditions) {
			VisitExpression(&cond.right);
		}
		// finally update the bindings with the result bindings of the join
		bindings = op.GetColumnBindings();
		return;
	}
	case LogicalOperatorType::LOGICAL_DELIM_JOIN: {
		auto &comp_join = op.Cast<LogicalComparisonJoin>();
		// depending on whether the delim join has been flipped, get the appropriate bindings
		if (comp_join.delim_flipped) {
			VisitOperator(*comp_join.children[1]);
			for (auto &cond : comp_join.conditions) {
				VisitExpression(&cond.right);
			}
		} else {
			VisitOperator(*comp_join.children[0]);
			for (auto &cond : comp_join.conditions) {
				VisitExpression(&cond.left);
			}
		}
		// visit the duplicate eliminated columns
		for (auto &expr : comp_join.duplicate_eliminated_columns) {
			VisitExpression(&expr);
		}
		// now get the other side
		if (comp_join.delim_flipped) {
			VisitOperator(*comp_join.children[0]);
			for (auto &cond : comp_join.conditions) {
				VisitExpression(&cond.left);
			}
		} else {
			VisitOperator(*comp_join.children[1]);
			for (auto &cond : comp_join.conditions) {
				VisitExpression(&cond.right);
			}
		}
		// finally update the bindings with the result bindings of the join
		bindings = op.GetColumnBindings();
		return;
	}
	case LogicalOperatorType::LOGICAL_ANY_JOIN: {
		// ANY join, this join is different because we evaluate the expression on the bindings of BOTH join sides at
		// once i.e. we set the bindings first to the bindings of the entire join, and then resolve the expressions of
		// this operator
		VisitOperatorChildren(op);
		bindings = op.GetColumnBindings();
		auto &any_join = op.Cast<LogicalAnyJoin>();
		if (any_join.join_type == JoinType::SEMI || any_join.join_type == JoinType::ANTI) {
			auto right_bindings = op.children[1]->GetColumnBindings();
			bindings.insert(bindings.end(), right_bindings.begin(), right_bindings.end());
		}
		if (any_join.join_type == JoinType::RIGHT_SEMI || any_join.join_type == JoinType::RIGHT_ANTI) {
			throw InternalException("RIGHT SEMI/ANTI any join not supported yet");
		}
		VisitOperatorExpressions(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_CREATE_INDEX: {
		// CREATE INDEX statement, add the columns of the table with table index 0 to the binding set
		// afterwards bind the expressions of the CREATE INDEX statement
		auto &create_index = op.Cast<LogicalCreateIndex>();
		bindings = LogicalOperator::GenerateColumnBindings(0, create_index.table.GetColumns().LogicalColumnCount());
		VisitOperatorExpressions(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_GET: {
		//! We first need to update the current set of bindings and then visit operator expressions
		bindings = op.GetColumnBindings();
		VisitOperatorExpressions(op);
		return;
	}
	case LogicalOperatorType::LOGICAL_INSERT: {
		//! We want to execute the normal path, but also add a dummy 'excluded' binding if there is a
		// ON CONFLICT DO UPDATE clause
		auto &insert_op = op.Cast<LogicalInsert>();
		if (insert_op.action_type != OnConflictAction::THROW) {
			// Get the bindings from the children
			VisitOperatorChildren(op);
			auto column_count = insert_op.table.GetColumns().PhysicalColumnCount();
			auto dummy_bindings = LogicalOperator::GenerateColumnBindings(insert_op.excluded_table_index, column_count);
			// Now insert our dummy bindings at the start of the bindings,
			// so the first 'column_count' indices of the chunk are reserved for our 'excluded' columns
			bindings.insert(bindings.begin(), dummy_bindings.begin(), dummy_bindings.end());
			if (insert_op.on_conflict_condition) {
				VisitExpression(&insert_op.on_conflict_condition);
			}
			if (insert_op.do_update_condition) {
				VisitExpression(&insert_op.do_update_condition);
			}
			VisitOperatorExpressions(op);
			bindings = op.GetColumnBindings();
			return;
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_EXTENSION_OPERATOR: {
		auto &ext_op = op.Cast<LogicalExtensionOperator>();
		ext_op.ResolveColumnBindings(*this, bindings);
		return;
	}
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE: {
		auto &rec = op.Cast<LogicalRecursiveCTE>();
		VisitOperatorChildren(op);
		bindings = op.GetColumnBindings();

		for (auto &expr : rec.key_targets) {
			VisitExpression(&expr);
		}
		return;
	}
	default:
		break;
	}

	// general case
	// first visit the children of this operator
	VisitOperatorChildren(op);
	// now visit the expressions of this operator to resolve any bound column references
	VisitOperatorExpressions(op);
	// finally update the current set of bindings to the current set of column bindings
	bindings = op.GetColumnBindings();
}